

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall dmlc::JSONReader::ReadString(JSONReader *this,string *out_str)

{
  bool bVar1;
  int iVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  string local_6b8 [32];
  string local_698;
  LogMessageFatal local_678;
  LogMessageFatal local_4f0;
  char local_361;
  ostringstream local_360 [7];
  char sch;
  ostringstream output;
  string local_1e8;
  LogMessageFatal local_1c8;
  char local_29;
  LogCheckError local_28;
  LogCheckError _check_err;
  int ch;
  string *out_str_local;
  JSONReader *this_local;
  
  _check_err.str._4_4_ = NextNonSpace(this);
  local_29 = '\"';
  LogCheck_EQ<int,char>((dmlc *)&local_28,(int *)((long)&_check_err.str + 4),&local_29);
  bVar1 = LogCheckError::operator_cast_to_bool(&local_28);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x2ab);
    poVar3 = LogMessageFatal::stream_abi_cxx11_(&local_1c8);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"ch == \'\\\"\'");
    poVar4 = std::operator<<(poVar4,(string *)local_28.str);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Error at");
    line_info_abi_cxx11_(&local_1e8,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4,", Expect \'\"\' but get \'");
    poVar4 = std::operator<<(poVar4,_check_err.str._4_1_);
    std::operator<<(poVar4,'\'');
    std::__cxx11::string::~string((string *)&local_1e8);
    LogMessageFatal::~LogMessageFatal(&local_1c8);
  }
  LogCheckError::~LogCheckError(&local_28);
  std::__cxx11::ostringstream::ostringstream(local_360);
  do {
    _check_err.str._4_4_ = NextChar(this);
    if (_check_err.str._4_4_ == 0x5c) {
      iVar2 = NextChar(this);
      local_361 = (char)iVar2;
      if (local_361 == '\"') {
        (anonymous_namespace)::Extend<char_const*>((ostream *)local_360,"\"");
      }
      else if (local_361 == '\\') {
        (anonymous_namespace)::Extend<char_const*>((ostream *)local_360,"\\");
      }
      else if (local_361 == 'n') {
        (anonymous_namespace)::Extend<char_const*>((ostream *)local_360,"\n");
      }
      else if (local_361 == 'r') {
        (anonymous_namespace)::Extend<char_const*>((ostream *)local_360,"\r");
      }
      else if (local_361 == 't') {
        (anonymous_namespace)::Extend<char_const*>((ostream *)local_360,"\t");
      }
      else {
        LogMessageFatal::LogMessageFatal
                  (&local_4f0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                   ,0x2c8);
        poVar3 = LogMessageFatal::stream_abi_cxx11_(&local_4f0);
        poVar4 = std::operator<<((ostream *)poVar3,"unknown string escape \\");
        std::operator<<(poVar4,local_361);
        LogMessageFatal::~LogMessageFatal(&local_4f0);
      }
    }
    else {
      if (_check_err.str._4_4_ == 0x22) {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)out_str,local_6b8);
        std::__cxx11::string::~string(local_6b8);
        std::__cxx11::ostringstream::~ostringstream(local_360);
        return;
      }
      anon_unknown_16::Extend<char>((ostream *)local_360,_check_err.str._4_1_);
    }
    if (((_check_err.str._4_4_ == -1) || (_check_err.str._4_4_ == 0xd)) ||
       (_check_err.str._4_4_ == 10)) {
      LogMessageFatal::LogMessageFatal
                (&local_678,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x2d0);
      poVar3 = LogMessageFatal::stream_abi_cxx11_(&local_678);
      poVar4 = std::operator<<((ostream *)poVar3,"Error at");
      line_info_abi_cxx11_(&local_698,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_698);
      std::operator<<(poVar4,", Expect \'\"\' but reach end of line ");
      std::__cxx11::string::~string((string *)&local_698);
      LogMessageFatal::~LogMessageFatal(&local_678);
    }
  } while( true );
}

Assistant:

inline void JSONReader::ReadString(std::string *out_str) {
  int ch = NextNonSpace();
  CHECK_EQ(ch, '\"')
      << "Error at" << line_info()
      << ", Expect \'\"\' but get \'" << static_cast<char>(ch) << '\'';
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  std::ostringstream output;
#else
  std::string output = "";
#endif
  while (true) {
    ch = NextChar();
    if (ch == '\\') {
      char sch = static_cast<char>(NextChar());
      switch (sch) {
      case 'r':
        Extend(&output, "\r");
        break;
      case 'n':
        Extend(&output, "\n");
        break;
      case '\\':
        Extend(&output, "\\");
        break;
      case 't':
        Extend(&output, "\t");
        break;
      case '\"':
        Extend(&output, "\"");
        break;
      default:
        LOG(FATAL) << "unknown string escape \\" << sch;
      }
    } else {
      if (ch == '\"')
        break;
      Extend(&output, static_cast<char>(ch));
    }
    if (ch == EOF || ch == '\r' || ch == '\n') {
      LOG(FATAL)
          << "Error at" << line_info()
          << ", Expect \'\"\' but reach end of line ";
    }
  }
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  *out_str = output.str();
#else
  *out_str = output;
#endif
}